

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

BOOL __thiscall
Js::GlobalObject::DeleteProperty
          (GlobalObject *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  HostObjectBase *pHVar1;
  PropertyQueryFlags PVar2;
  BOOL BVar3;
  int iVar4;
  RecyclableObject *pRVar5;
  
  PVar2 = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,(PropertyValueInfo *)0x0)
  ;
  if (PVar2 == Property_Found) {
    BVar3 = DynamicObject::DeleteProperty((DynamicObject *)this,propertyId,flags);
    return BVar3;
  }
  pRVar5 = (this->directHostObject).ptr;
  if (pRVar5 != (RecyclableObject *)0x0) {
    iVar4 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xb])(pRVar5,(ulong)(uint)propertyId,0);
    if (iVar4 == 1) {
      pRVar5 = (this->directHostObject).ptr;
      goto LAB_00b5d5cd;
    }
  }
  pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
  if (pHVar1 != (HostObjectBase *)0x0) {
    iVar4 = (**(code **)(*(long *)pHVar1 + 0x58))(pHVar1,propertyId,0);
    if (iVar4 == 1) {
      pRVar5 = (RecyclableObject *)(this->super_RootObjectBase).hostObject.ptr;
LAB_00b5d5cd:
      iVar4 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x21])(pRVar5,(ulong)(uint)propertyId,(ulong)flags);
      return iVar4;
    }
  }
  return 1;
}

Assistant:

BOOL GlobalObject::DeleteProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(__super::HasPropertyQuery(propertyId, nullptr /*info*/)))
        {
            return __super::DeleteProperty(propertyId, flags);
        }
        else if (this->directHostObject && this->directHostObject->HasProperty(propertyId))
        {
            return this->directHostObject->DeleteProperty(propertyId, flags);
        }
        else if (this->hostObject && this->hostObject->HasProperty(propertyId))
        {
            return this->hostObject->DeleteProperty(propertyId, flags);
        }

        // Non-existent property
        return TRUE;
    }